

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

void __thiscall
mp::
BasicExprVisitor<mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>,_void,_mp::internal::ExprTypes>
::Visit(BasicExprVisitor<mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>,_void,_mp::internal::ExprTypes>
        *this,Expr e)

{
  FormatSpec FStack_18;
  
  switch(*(undefined4 *)e.super_ExprBase.impl_) {
  case 2:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitVariable((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                   *)this,(Variable)e.super_ExprBase.impl_);
    return;
  case 3:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitCommonExpr((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                     *)this,(CommonExpr)e.super_ExprBase.impl_);
    return;
  case 4:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitMinus((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                *)this,(UnaryExpr)e.super_ExprBase.impl_);
    return;
  case 5:
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitUnary((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                *)this,(UnaryExpr)e.super_ExprBase.impl_);
    return;
  case 9:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitPow2((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
               *)this,(UnaryExpr)e.super_ExprBase.impl_);
    return;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
    WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
              ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
                *)this,(BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                        )e.super_ExprBase.impl_);
    return;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitBinaryFunc((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                     *)this,(BinaryExpr)e.super_ExprBase.impl_);
    return;
  case 0x27:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitIf((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
             *)this,(IfExpr)e.super_ExprBase.impl_);
    return;
  case 0x28:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitPLTerm((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                 *)this,(PLTerm)e.super_ExprBase.impl_);
    return;
  case 0x29:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitCall((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
               *)this,(CallExpr)e.super_ExprBase.impl_);
    return;
  case 0x2a:
  case 0x2b:
    ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
    WriteFunc<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
                *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                        )e.super_ExprBase.impl_);
    return;
  case 0x2c:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitSum((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
              *)this,(SumExpr)e.super_ExprBase.impl_);
    return;
  case 0x2d:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitNumberOf((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                   *)this,(NumberOfExpr)e.super_ExprBase.impl_);
    return;
  case 0x2e:
  case 0x45:
  case 0x46:
  case 0x47:
    VisitUnsupported(this,e);
    return;
  case 0x2f:
    ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
    WriteFunc<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
              ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
                *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                        )e.super_ExprBase.impl_);
    return;
  case 0x30:
    fmt::BasicWriter<char>::write_decimal<int>
              ((BasicWriter<char> *)this[1]._vptr_BasicExprVisitor,
               (uint)*(byte *)((long)e.super_ExprBase.impl_ + 4));
    return;
  case 0x31:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitNot((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
              *)this,(NotExpr)e.super_ExprBase.impl_);
    return;
  case 0x32:
  case 0x33:
  case 0x34:
    ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
    WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
              ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
                *)this,(BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
                        )e.super_ExprBase.impl_);
    return;
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
    ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
    WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
              ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
                *)this,(BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                        )e.super_ExprBase.impl_);
    return;
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitLogicalCount((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                       *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    return;
  case 0x41:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitImplication((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                      *)this,(ImplicationExpr)e.super_ExprBase.impl_);
    return;
  case 0x42:
  case 0x43:
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    VisitIteratedLogical
              ((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                *)this,(IteratedLogicalExpr)e.super_ExprBase.impl_);
    return;
  case 0x44:
    ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
    WriteFunc<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
              ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
                *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                        )e.super_ExprBase.impl_);
    return;
  default:
    FStack_18.super_AlignSpec.super_WidthSpec.width_ = 0;
    FStack_18.super_AlignSpec.super_WidthSpec.fill_ = L' ';
    FStack_18.super_AlignSpec.align_ = ALIGN_DEFAULT;
    FStack_18.flags_ = 0;
    FStack_18.precision_ = -1;
    FStack_18.type_ = '\0';
    fmt::BasicWriter<char>::write_double<double>
              ((BasicWriter<char> *)this[1]._vptr_BasicExprVisitor,
               *(double *)((long)e.super_ExprBase.impl_ + 8),&FStack_18);
    return;
  }
}

Assistant:

expr::Kind kind() const { return kind_; }